

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketData.h
# Opt level: O2

void __thiscall uWS::WebSocketData::~WebSocketData(WebSocketData *this)

{
  DeflationStream *this_00;
  _List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *this_01;
  
  this_00 = this->deflationStream;
  if (this_00 != (DeflationStream *)0x0) {
    DeflationStream::~DeflationStream(this_00);
    operator_delete(this_00,0x70);
  }
  this_01 = (_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)this->subscriber;
  if (this_01 != (_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)0x0) {
    std::__cxx11::_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::_M_clear(this_01);
    operator_delete(this_01,0x20);
  }
  std::__cxx11::string::~string((string *)&this->fragmentBuffer);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~WebSocketData() {
        if (deflationStream) {
            delete deflationStream;
        }

        if (subscriber) {
            delete subscriber;
        }
    }